

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.hpp
# Opt level: O2

void __thiscall adiak::catstring::catstring(catstring *this,string *cs)

{
  (this->v)._M_dataplus._M_p = (pointer)&(this->v).field_2;
  (this->v)._M_string_length = 0;
  (this->v).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

catstring(std::string cs) { v = cs; }